

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

TRef recff_bit64_tohex(jit_State *J,RecordFFData *rd,TRef hdr)

{
  uint uVar1;
  RecordFFData *pRVar2;
  undefined2 uVar3;
  TRef TVar4;
  uint64_t uVar5;
  CTypeID local_c0;
  uint local_bc;
  CTypeID id2;
  int32_t n;
  SFormat sf;
  TRef trsf;
  TRef tr;
  CTypeID id;
  CTState *cts;
  RecordFFData *pRStack_98;
  TRef hdr_local;
  RecordFFData *rd_local;
  jit_State *J_local;
  RecordFFData *local_80;
  undefined2 local_76;
  undefined2 local_74;
  undefined2 local_72;
  RecordFFData *local_70;
  undefined2 local_66;
  undefined2 local_64;
  undefined2 local_62;
  RecordFFData *local_60;
  undefined2 local_56;
  undefined2 local_54;
  undefined2 local_52;
  RecordFFData *local_50;
  TRef local_44;
  CTState *local_40;
  undefined4 local_34;
  CTState *local_30;
  undefined4 local_24;
  CTState *local_20;
  TRef local_14;
  CTState *local_10;
  
  _tr = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  cts._4_4_ = hdr;
  pRStack_98 = rd;
  rd_local = (RecordFFData *)J;
  trsf = crec_bit64_type(_tr,rd->argv);
  n = *(int *)(*(long *)&rd_local[6].data + 4);
  id2 = 0x14;
  if (n == 0) {
    local_bc = 8;
    if (trsf != 0) {
      local_bc = 0x10;
    }
    n = 0;
  }
  else {
    local_c0 = 0;
    uVar5 = lj_carith_check64((lua_State *)rd_local[5].nres,2,&local_c0);
    local_bc = (uint)uVar5;
    if (local_c0 == 0) {
      n = lj_opt_narrow_tobit((jit_State *)rd_local,n);
    }
    else {
      local_30 = _tr;
      local_34 = 9;
      local_20 = _tr;
      local_24 = 9;
      n = crec_ct_tv((jit_State *)rd_local,_tr->tab + 9,0,n,pRStack_98->argv + 1);
    }
    pRVar2 = rd_local;
    uVar3 = (undefined2)n;
    TVar4 = lj_ir_kint((jit_State *)rd_local,local_bc);
    local_50 = pRVar2;
    local_52 = 0x893;
    local_56 = (undefined2)TVar4;
    *(undefined2 *)&pRVar2[7].field_0x14 = 0x893;
    *(undefined2 *)&pRVar2[7].data = uVar3;
    *(undefined2 *)((long)&pRVar2[7].data + 2) = local_56;
    local_54 = uVar3;
    lj_opt_fold((jit_State *)rd_local);
  }
  if ((int)local_bc < 0) {
    local_bc = (local_bc ^ 0xffffffff) + 1;
    id2 = id2 | 0x2000;
  }
  if (0xfe < local_bc) {
    local_bc = 0xfe;
  }
  id2 = (local_bc + 1) * 0x1000000 | id2;
  if (trsf == 0) {
    sf = lj_opt_narrow_tobit((jit_State *)rd_local,**(TRef **)&rd_local[6].data);
    pRVar2 = rd_local;
    if ((int)local_bc < 8) {
      uVar3 = (undefined2)sf;
      TVar4 = lj_ir_kint((jit_State *)rd_local,(1 << ((byte)(local_bc << 2) & 0x1f)) + -1);
      local_70 = pRVar2;
      local_72 = 0x2113;
      local_76 = (undefined2)TVar4;
      *(undefined2 *)&pRVar2[7].field_0x14 = 0x2113;
      *(undefined2 *)&pRVar2[7].data = uVar3;
      *(undefined2 *)((long)&pRVar2[7].data + 2) = local_76;
      local_74 = uVar3;
      sf = lj_opt_fold((jit_State *)rd_local);
    }
    local_80 = rd_local;
    J_local._6_2_ = 0x5b16;
    J_local._4_2_ = (undefined2)sf;
    J_local._2_2_ = 0x2d3;
    *(undefined2 *)&rd_local[7].field_0x14 = 0x5b16;
    *(undefined2 *)&rd_local[7].data = J_local._4_2_;
    *(undefined2 *)((long)&rd_local[7].data + 2) = 0x2d3;
    sf = lj_opt_fold((jit_State *)rd_local);
  }
  else {
    local_40 = _tr;
    local_44 = trsf;
    local_10 = _tr;
    local_14 = trsf;
    sf = crec_ct_tv((jit_State *)rd_local,_tr->tab + trsf,0,**(TRef **)&rd_local[6].data,
                    pRStack_98->argv);
    pRVar2 = rd_local;
    if ((int)local_bc < 0x10) {
      uVar3 = (undefined2)sf;
      TVar4 = lj_ir_kint64((jit_State *)rd_local,(1L << ((byte)(local_bc << 2) & 0x3f)) - 1);
      local_60 = pRVar2;
      local_62 = 0x2116;
      local_66 = (undefined2)TVar4;
      *(undefined2 *)&pRVar2[7].field_0x14 = 0x2116;
      *(undefined2 *)&pRVar2[7].data = uVar3;
      *(undefined2 *)((long)&pRVar2[7].data + 2) = local_66;
      local_64 = uVar3;
      sf = lj_opt_fold((jit_State *)rd_local);
    }
  }
  pRVar2 = rd_local;
  uVar1 = cts._4_4_;
  TVar4 = lj_ir_kint((jit_State *)rd_local,id2);
  TVar4 = lj_ir_call((jit_State *)pRVar2,IRCALL_lj_strfmt_putfxint,(ulong)uVar1,(ulong)TVar4,
                     (ulong)sf);
  return TVar4;
}

Assistant:

TRef recff_bit64_tohex(jit_State *J, RecordFFData *rd, TRef hdr)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTypeID id = crec_bit64_type(cts, &rd->argv[0]);
  TRef tr, trsf = J->base[1];
  SFormat sf = (STRFMT_UINT|STRFMT_T_HEX);
  int32_t n;
  if (trsf) {
    CTypeID id2 = 0;
    n = (int32_t)lj_carith_check64(J->L, 2, &id2);
    if (id2)
      trsf = crec_ct_tv(J, ctype_get(cts, CTID_INT32), 0, trsf, &rd->argv[1]);
    else
      trsf = lj_opt_narrow_tobit(J, trsf);
    emitir(IRTGI(IR_EQ), trsf, lj_ir_kint(J, n));  /* Specialize to n. */
  } else {
    n = id ? 16 : 8;
  }
  if (n < 0) { n = (int32_t)(~n+1u); sf |= STRFMT_F_UPPER; }
  if ((uint32_t)n > 254) n = 254;
  sf |= ((SFormat)((n+1)&255) << STRFMT_SH_PREC);
  if (id) {
    tr = crec_ct_tv(J, ctype_get(cts, id), 0, J->base[0], &rd->argv[0]);
    if (n < 16)
      tr = emitir(IRT(IR_BAND, IRT_U64), tr,
		  lj_ir_kint64(J, ((uint64_t)1 << 4*n)-1));
  } else {
    tr = lj_opt_narrow_tobit(J, J->base[0]);
    if (n < 8)
      tr = emitir(IRTI(IR_BAND), tr, lj_ir_kint(J, (int32_t)((1u << 4*n)-1)));
    tr = emitconv(tr, IRT_U64, IRT_INT, 0);  /* No sign-extension. */
    lj_needsplit(J);
  }
  return lj_ir_call(J, IRCALL_lj_strfmt_putfxint, hdr, lj_ir_kint(J, sf), tr);
}